

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O2

bool __thiscall TCBPoint::operator==(TCBPoint *this,TCBPoint *other)

{
  bool bVar1;
  
  bVar1 = qFuzzyCompare(&this->_point,&other->_point);
  if (bVar1) {
    bVar1 = qFuzzyCompare(this->_t,other->_t);
    if (bVar1) {
      bVar1 = qFuzzyCompare(this->_c,other->_c);
      if (bVar1) {
        bVar1 = qFuzzyCompare(this->_b,other->_b);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const TCBPoint &other) const
    {
        return _point == other._point &&
                qFuzzyCompare(_t, other._t) &&
                qFuzzyCompare(_c, other._c) &&
                qFuzzyCompare(_b, other._b);
    }